

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O3

PaError PaAlsaStreamComponent_DetermineFramesPerBuffer
                  (PaAlsaStreamComponent *self,PaStreamParameters *params,
                  unsigned_long framesPerUserBuffer,double sampleRate,snd_pcm_hw_params_t *hwParams,
                  int *accurate)

{
  int iVar1;
  ulong uVar2;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  ulong extraout_RAX_03;
  char *errorText;
  uint uVar3;
  char *format;
  PaStreamParameters *pPVar4;
  PaStreamParameters *pPVar5;
  long lVar6;
  PaStreamParameters *pPVar7;
  double in_XMM1_Qa;
  unsigned_long framesPerHostBuffer;
  uint minPeriods;
  uint maxPeriods;
  PaStreamParameters *local_58;
  int local_4c;
  PaStreamParameters *local_48;
  PaStreamParameters *local_40;
  snd_pcm_hw_params_t *local_38;
  
  uVar3 = numPeriods_;
  uVar2 = (ulong)(sampleRate * in_XMM1_Qa);
  pPVar5 = (PaStreamParameters *)
           ((long)(sampleRate * in_XMM1_Qa - 9.223372036854776e+18) & (long)uVar2 >> 0x3f | uVar2);
  if (pPVar5 <= params) {
    pPVar5 = params;
  }
  local_40 = (PaStreamParameters *)((ulong)local_40 & 0xffffffff00000000);
  local_48 = (PaStreamParameters *)CONCAT44(local_48._4_4_,numPeriods_);
  local_4c = 0;
  local_38 = hwParams;
  iVar1 = snd_pcm_hw_params_get_periods_min(framesPerUserBuffer);
  if (iVar1 < 0) {
    format = 
    "Expression \'alsa_snd_pcm_hw_params_get_periods_min( hwParams, &minPeriods, &dir )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2326\n"
    ;
    PaAlsaStreamComponent_DetermineFramesPerBuffer_cold_1();
    uVar2 = extraout_RAX;
    goto LAB_001117df;
  }
  iVar1 = snd_pcm_hw_params_get_periods_max(framesPerUserBuffer,&local_40,&local_4c);
  if (iVar1 < 0) {
    format = 
    "Expression \'alsa_snd_pcm_hw_params_get_periods_max( hwParams, &maxPeriods, &dir )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2327\n"
    ;
    PaAlsaStreamComponent_DetermineFramesPerBuffer_cold_2();
    uVar2 = extraout_RAX_00;
    goto LAB_001117df;
  }
  if ((uint)local_40 < 2) {
    __assert_fail("maxPeriods > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                  ,0x918,
                  "PaError PaAlsaStreamComponent_DetermineFramesPerBuffer(PaAlsaStreamComponent *, const PaStreamParameters *, unsigned long, double, snd_pcm_hw_params_t *, int *)"
                 );
  }
  if (uVar3 < (uint)local_48) {
    uVar3 = (uint)local_48;
  }
  if ((uint)local_40 < uVar3) {
    uVar3 = (uint)local_40;
  }
  pPVar5 = (PaStreamParameters *)
           ((ulong)((long)&params->device + (long)&pPVar5->device) / (ulong)uVar3);
  local_58 = pPVar5;
  if (params != (PaStreamParameters *)0x0) {
    lVar6 = (long)params - (ulong)pPVar5 % (ulong)params;
    if ((ulong)pPVar5 % (ulong)params == 0) {
      lVar6 = 0;
    }
    pPVar5 = (PaStreamParameters *)((long)&pPVar5->device + lVar6);
    pPVar4 = (PaStreamParameters *)((long)pPVar5 - (long)params);
    local_58 = pPVar5;
    if (pPVar5 < params) {
      if ((ulong)params % (ulong)pPVar5 != 0) {
        __assert_fail("framesPerUserBuffer % framesPerHostBuffer == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                      ,0x92d,
                      "PaError PaAlsaStreamComponent_DetermineFramesPerBuffer(PaAlsaStreamComponent *, const PaStreamParameters *, unsigned long, double, snd_pcm_hw_params_t *, int *)"
                     );
      }
      iVar1 = snd_pcm_hw_params_test_period_size(self->pcm,framesPerUserBuffer,pPVar5,0);
      if (iVar1 < 0) {
        pPVar7 = (PaStreamParameters *)((long)pPVar5 * 2);
        iVar1 = snd_pcm_hw_params_test_period_size(self->pcm,framesPerUserBuffer,pPVar7,0);
        if (iVar1 != 0) {
          pPVar7 = (PaStreamParameters *)((ulong)pPVar5 >> 1);
          iVar1 = snd_pcm_hw_params_test_period_size(self->pcm,framesPerUserBuffer,pPVar7,0);
          if (iVar1 != 0) goto LAB_001116d4;
        }
LAB_001116cd:
        pPVar5 = pPVar7;
        local_58 = pPVar7;
      }
    }
    else {
      if ((ulong)pPVar5 % (ulong)params != 0) {
        __assert_fail("framesPerHostBuffer % framesPerUserBuffer == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                      ,0x938,
                      "PaError PaAlsaStreamComponent_DetermineFramesPerBuffer(PaAlsaStreamComponent *, const PaStreamParameters *, unsigned long, double, snd_pcm_hw_params_t *, int *)"
                     );
      }
      iVar1 = snd_pcm_hw_params_test_period_size(self->pcm,framesPerUserBuffer,pPVar5,0);
      if (iVar1 < 0) {
        pPVar7 = (PaStreamParameters *)((long)&pPVar5->device + (long)&params->device);
        iVar1 = snd_pcm_hw_params_test_period_size(self->pcm,framesPerUserBuffer,pPVar7,0);
        if (iVar1 == 0) goto LAB_001116cd;
        iVar1 = snd_pcm_hw_params_test_period_size(self->pcm,framesPerUserBuffer,pPVar4,0);
        if (iVar1 == 0) {
          pPVar5 = pPVar4;
          local_58 = pPVar4;
        }
      }
    }
  }
LAB_001116d4:
  local_40 = (PaStreamParameters *)0x0;
  local_48 = (PaStreamParameters *)0x0;
  iVar1 = snd_pcm_hw_params_get_period_size_min(framesPerUserBuffer,&local_40,0);
  if (iVar1 < 0) {
    format = 
    "Expression \'alsa_snd_pcm_hw_params_get_period_size_min( hwParams, &min, NULL )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2441\n"
    ;
    PaAlsaStreamComponent_DetermineFramesPerBuffer_cold_3();
    uVar2 = extraout_RAX_01;
  }
  else {
    iVar1 = snd_pcm_hw_params_get_period_size_max(framesPerUserBuffer,&local_48,0);
    if (iVar1 < 0) {
      format = 
      "Expression \'alsa_snd_pcm_hw_params_get_period_size_max( hwParams, &max, NULL )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2442\n"
      ;
      PaAlsaStreamComponent_DetermineFramesPerBuffer_cold_4();
      uVar2 = extraout_RAX_02;
    }
    else {
      if (pPVar5 < local_40) {
        local_58 = (PaStreamParameters *)
                   ((long)&local_40->device + (ulong)((long)local_48 - (long)local_40 == 2));
      }
      else if (local_48 < pPVar5) {
        local_58 = (PaStreamParameters *)
                   ((long)local_48 - (ulong)((long)local_48 - (long)local_40 == 2));
      }
      local_4c = 0;
      iVar1 = snd_pcm_hw_params_set_period_size_near(self->pcm,framesPerUserBuffer,&local_58);
      if (-1 < iVar1) {
        if (local_4c != 0) {
          *(undefined4 *)local_38 = 0;
        }
        self->framesPerPeriod = (snd_pcm_uframes_t)local_58;
        return 0;
      }
      format = 
      "Expression \'alsa_snd_pcm_hw_params_set_period_size_near( self->pcm, hwParams, &framesPerHostBuffer, &dir )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2463\n"
      ;
      PaAlsaStreamComponent_DetermineFramesPerBuffer_cold_5();
      uVar2 = extraout_RAX_03;
    }
  }
LAB_001117df:
  if ((uVar2 & 1) == 0) {
    errorText = (char *)snd_strerror(iVar1);
    PaUtil_SetLastHostErrorInfo(paALSA,(long)iVar1,errorText);
  }
  PaUtil_DebugPrint(format);
  return -9999;
}

Assistant:

static PaError PaAlsaStreamComponent_DetermineFramesPerBuffer( PaAlsaStreamComponent* self, const PaStreamParameters* params,
        unsigned long framesPerUserBuffer, double sampleRate, snd_pcm_hw_params_t* hwParams, int* accurate )
{
    PaError result = paNoError;
    unsigned long bufferSize, framesPerHostBuffer;
    int dir = 0;

    /* Calculate host buffer size */
    bufferSize = PaAlsa_GetFramesPerHostBuffer(framesPerUserBuffer, params->suggestedLatency, sampleRate);

    /* Log */
    PA_DEBUG(( "%s: user-buffer (frames)           = %lu\n", __FUNCTION__, framesPerUserBuffer ));
    PA_DEBUG(( "%s: user-buffer (sec)              = %f\n",  __FUNCTION__, (double)(framesPerUserBuffer / sampleRate) ));
    PA_DEBUG(( "%s: suggested latency (sec)        = %f\n",  __FUNCTION__, params->suggestedLatency ));
    PA_DEBUG(( "%s: suggested host buffer (frames) = %lu\n", __FUNCTION__, bufferSize ));
    PA_DEBUG(( "%s: suggested host buffer (sec)    = %f\n",  __FUNCTION__, (double)(bufferSize / sampleRate) ));

#ifdef PA_ALSA_USE_OBSOLETE_HOST_BUFFER_CALC

    if( framesPerUserBuffer != paFramesPerBufferUnspecified )
    {
        /* Preferably the host buffer size should be a multiple of the user buffer size */

        if( bufferSize > framesPerUserBuffer )
        {
            snd_pcm_uframes_t remainder = bufferSize % framesPerUserBuffer;
            if( remainder > framesPerUserBuffer / 2. )
                bufferSize += framesPerUserBuffer - remainder;
            else
                bufferSize -= remainder;

            assert( bufferSize % framesPerUserBuffer == 0 );
        }
        else if( framesPerUserBuffer % bufferSize != 0 )
        {
            /*  Find a good compromise between user specified latency and buffer size */
            if( bufferSize > framesPerUserBuffer * .75 )
            {
                bufferSize = framesPerUserBuffer;
            }
            else
            {
                snd_pcm_uframes_t newSz = framesPerUserBuffer;
                while( newSz / 2 >= bufferSize )
                {
                    if( framesPerUserBuffer % (newSz / 2) != 0 )
                    {
                        /* No use dividing any further */
                        break;
                    }
                    newSz /= 2;
                }
                bufferSize = newSz;
            }

            assert( framesPerUserBuffer % bufferSize == 0 );
        }
    }

#endif

    {
        unsigned numPeriods = numPeriods_, maxPeriods = 0, minPeriods = numPeriods_;

        /* It may be that the device only supports 2 periods for instance */
        dir = 0;
        ENSURE_( alsa_snd_pcm_hw_params_get_periods_min( hwParams, &minPeriods, &dir ), paUnanticipatedHostError );
        ENSURE_( alsa_snd_pcm_hw_params_get_periods_max( hwParams, &maxPeriods, &dir ), paUnanticipatedHostError );
        assert( maxPeriods > 1 );

        /* Clamp to min/max */
        numPeriods = PA_MIN(maxPeriods, PA_MAX(minPeriods, numPeriods));

        PA_DEBUG(( "%s: periods min = %lu, max = %lu, req = %lu \n", __FUNCTION__, minPeriods, maxPeriods, numPeriods ));

#ifndef PA_ALSA_USE_OBSOLETE_HOST_BUFFER_CALC

        /* Calculate period size */
        framesPerHostBuffer = (bufferSize / numPeriods);

        /* Align & test size */
        if( framesPerUserBuffer != paFramesPerBufferUnspecified )
        {
            /* Align to user buffer size */
            framesPerHostBuffer = PaAlsa_AlignForward(framesPerHostBuffer, framesPerUserBuffer);

            /* Test (borrowed from older implementation) */
            if( framesPerHostBuffer < framesPerUserBuffer )
            {
                assert( framesPerUserBuffer % framesPerHostBuffer == 0 );
                if( alsa_snd_pcm_hw_params_test_period_size( self->pcm, hwParams, framesPerHostBuffer, 0 ) < 0 )
                {
                    if( alsa_snd_pcm_hw_params_test_period_size( self->pcm, hwParams, framesPerHostBuffer * 2, 0 ) == 0 )
                        framesPerHostBuffer *= 2;
                    else if( alsa_snd_pcm_hw_params_test_period_size( self->pcm, hwParams, framesPerHostBuffer / 2, 0 ) == 0 )
                        framesPerHostBuffer /= 2;
                }
            }
            else
            {
                assert( framesPerHostBuffer % framesPerUserBuffer == 0 );
                if( alsa_snd_pcm_hw_params_test_period_size( self->pcm, hwParams, framesPerHostBuffer, 0 ) < 0 )
                {
                    if( alsa_snd_pcm_hw_params_test_period_size( self->pcm, hwParams, framesPerHostBuffer + framesPerUserBuffer, 0 ) == 0 )
                        framesPerHostBuffer += framesPerUserBuffer;
                    else if( alsa_snd_pcm_hw_params_test_period_size( self->pcm, hwParams, framesPerHostBuffer - framesPerUserBuffer, 0 ) == 0 )
                        framesPerHostBuffer -= framesPerUserBuffer;
                }
            }
        }
#endif

#ifdef PA_ALSA_USE_OBSOLETE_HOST_BUFFER_CALC

        if( framesPerUserBuffer != paFramesPerBufferUnspecified )
        {
            /* Try to get a power-of-two of the user buffer size. */
            framesPerHostBuffer = framesPerUserBuffer;
            if( framesPerHostBuffer < bufferSize )
            {
                while( bufferSize / framesPerHostBuffer > numPeriods )
                {
                    framesPerHostBuffer *= 2;
                }
                /* One extra period is preferrable to one less (should be more robust) */
                if( bufferSize / framesPerHostBuffer < numPeriods )
                {
                    framesPerHostBuffer /= 2;
                }
            }
            else
            {
                while( bufferSize / framesPerHostBuffer < numPeriods )
                {
                    if( framesPerUserBuffer % ( framesPerHostBuffer / 2 ) != 0 )
                    {
                        /* Can't be divided any further */
                        break;
                    }
                    framesPerHostBuffer /= 2;
                }
            }

            if( framesPerHostBuffer < framesPerUserBuffer )
            {
                assert( framesPerUserBuffer % framesPerHostBuffer == 0 );
                if( alsa_snd_pcm_hw_params_test_period_size( self->pcm, hwParams, framesPerHostBuffer, 0 ) < 0 )
                {
                    if( alsa_snd_pcm_hw_params_test_period_size( self->pcm, hwParams, framesPerHostBuffer * 2, 0 ) == 0 )
                        framesPerHostBuffer *= 2;
                    else if( alsa_snd_pcm_hw_params_test_period_size( self->pcm, hwParams, framesPerHostBuffer / 2, 0 ) == 0 )
                        framesPerHostBuffer /= 2;
                }
            }
            else
            {
                assert( framesPerHostBuffer % framesPerUserBuffer == 0 );
                if( alsa_snd_pcm_hw_params_test_period_size( self->pcm, hwParams, framesPerHostBuffer, 0 ) < 0 )
                {
                    if( alsa_snd_pcm_hw_params_test_period_size( self->pcm, hwParams, framesPerHostBuffer + framesPerUserBuffer, 0 ) == 0 )
                        framesPerHostBuffer += framesPerUserBuffer;
                    else if( alsa_snd_pcm_hw_params_test_period_size( self->pcm, hwParams, framesPerHostBuffer - framesPerUserBuffer, 0 ) == 0 )
                        framesPerHostBuffer -= framesPerUserBuffer;
                }
            }
        }
        else
        {
            framesPerHostBuffer = bufferSize / numPeriods;
        }

        /* non-mmap mode needs a reasonably-sized buffer or it'll stutter */
        if( !self->canMmap && framesPerHostBuffer < 2048 )
            framesPerHostBuffer = 2048;
#endif
        PA_DEBUG(( "%s: suggested host buffer period   = %lu \n", __FUNCTION__, framesPerHostBuffer ));
    }

    {
        /* Get min/max period sizes and adjust our chosen */
        snd_pcm_uframes_t min = 0, max = 0, minmax_diff;
        ENSURE_( alsa_snd_pcm_hw_params_get_period_size_min( hwParams, &min, NULL ), paUnanticipatedHostError );
        ENSURE_( alsa_snd_pcm_hw_params_get_period_size_max( hwParams, &max, NULL ), paUnanticipatedHostError );
        minmax_diff = max - min;

        if( framesPerHostBuffer < min )
        {
            PA_DEBUG(( "%s: The determined period size (%lu) is less than minimum (%lu)\n", __FUNCTION__, framesPerHostBuffer, min ));
            framesPerHostBuffer = (( minmax_diff == 2 ) ? min + 1 : min );
        }
        else if( framesPerHostBuffer > max )
        {
            PA_DEBUG(( "%s: The determined period size (%lu) is greater than maximum (%lu)\n", __FUNCTION__, framesPerHostBuffer, max ));
            framesPerHostBuffer = (( minmax_diff == 2 ) ? max - 1 : max );
        }

        PA_DEBUG(( "%s: device period minimum          = %lu\n", __FUNCTION__, min ));
        PA_DEBUG(( "%s: device period maximum          = %lu\n", __FUNCTION__, max ));
        PA_DEBUG(( "%s: host buffer period             = %lu\n", __FUNCTION__, framesPerHostBuffer ));
        PA_DEBUG(( "%s: host buffer period latency     = %f\n", __FUNCTION__, (double)( framesPerHostBuffer / sampleRate ) ));

        /* Try setting period size */
        dir = 0;
        ENSURE_( alsa_snd_pcm_hw_params_set_period_size_near( self->pcm, hwParams, &framesPerHostBuffer, &dir ), paUnanticipatedHostError );
        if( dir != 0 )
        {
            PA_DEBUG(( "%s: The configured period size is non-integer.\n", __FUNCTION__, dir ));
            *accurate = 0;
        }
    }

    /* Set result */
    self->framesPerPeriod = framesPerHostBuffer;

error:
    return result;
}